

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

bam_hdr_t * sam_hdr_read(htsFile *fp)

{
  htsExactFormat hVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  char *length;
  char *name;
  FILE *f;
  char line [2048];
  int has_SQ;
  bam_hdr_t *h;
  kstring_t str;
  htsFile *fp_local;
  
  hVar1 = (fp->format).format;
  str.s = (char *)fp;
  if (hVar1 == sam) {
    bVar2 = false;
    str.l = 0;
    h = (bam_hdr_t *)0x0;
    str.m = 0;
    while ((iVar3 = hts_getline((htsFile *)str.s,2,(kstring_t *)(str.s + 0x10)), -1 < iVar3 &&
           (**(char **)(str.s + 0x20) == '@'))) {
      if ((3 < *(ulong *)(str.s + 0x10)) &&
         (iVar3 = strncmp(*(char **)(str.s + 0x20),"@SQ",3), iVar3 == 0)) {
        bVar2 = true;
      }
      kputsn(*(char **)(str.s + 0x20),(int)*(undefined8 *)(str.s + 0x10),(kstring_t *)&h);
      kputc(10,(kstring_t *)&h);
    }
    if ((!bVar2) && (*(long *)(str.s + 0x30) != 0)) {
      __stream = fopen(*(char **)(str.s + 0x30),"r");
      if (__stream == (FILE *)0x0) {
        return (bam_hdr_t *)0x0;
      }
      while (pcVar4 = fgets((char *)&f,0x800,__stream), pcVar4 != (char *)0x0) {
        pcVar4 = strtok((char *)&f,"\t");
        pcVar5 = strtok((char *)0x0,"\t");
        ksprintf((kstring_t *)&h,"@SQ\tSN:%s\tLN:%s\n",pcVar4,pcVar5);
      }
      fclose(__stream);
    }
    if (h == (bam_hdr_t *)0x0) {
      kputsn("",0,(kstring_t *)&h);
    }
    fp_local = (htsFile *)sam_hdr_parse((int)h,(char *)str.m);
    *(uint32_t *)&fp_local->lineno = (uint32_t)h;
    fp_local->fn = (char *)str.m;
  }
  else if (hVar1 == bam) {
    fp_local = (htsFile *)bam_hdr_read((fp->fp).bgzf);
  }
  else {
    if (hVar1 != cram) {
      abort();
    }
    fp_local = (htsFile *)cram_header_to_bam(((fp->fp).cram)->header);
  }
  return (bam_hdr_t *)fp_local;
}

Assistant:

bam_hdr_t *sam_hdr_read(htsFile *fp)
{
    switch (fp->format.format) {
    case bam:
        return bam_hdr_read(fp->fp.bgzf);

    case cram:
        return cram_header_to_bam(fp->fp.cram->header);

    case sam: {
        kstring_t str;
        bam_hdr_t *h;
        int has_SQ = 0;
        str.l = str.m = 0; str.s = 0;
        while (hts_getline(fp, KS_SEP_LINE, &fp->line) >= 0) {
            if (fp->line.s[0] != '@') break;
            if (fp->line.l > 3 && strncmp(fp->line.s,"@SQ",3) == 0) has_SQ = 1;
            kputsn(fp->line.s, fp->line.l, &str);
            kputc('\n', &str);
        }
        if (! has_SQ && fp->fn_aux) {
            char line[2048];
            FILE *f = fopen(fp->fn_aux, "r");
            if (f == NULL) return NULL;
            while (fgets(line, sizeof line, f)) {
                const char *name = strtok(line, "\t");
                const char *length = strtok(NULL, "\t");
                ksprintf(&str, "@SQ\tSN:%s\tLN:%s\n", name, length);
            }
            fclose(f);
        }
        if (str.l == 0) kputsn("", 0, &str);
        h = sam_hdr_parse(str.l, str.s);
        h->l_text = str.l; h->text = str.s;
        return h;
        }

    default:
        abort();
    }
}